

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

int __thiscall
QKeySequenceEditPrivate::translateModifiers
          (QKeySequenceEditPrivate *this,KeyboardModifiers state,QString *text)

{
  Int IVar1;
  long in_FS_OFFSET;
  int result;
  KeyboardModifier in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_18;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_14;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  local_10.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorage<Qt::KeyboardModifier>)
       QFlags<Qt::KeyboardModifier>::operator&
                 ((QFlags<Qt::KeyboardModifier> *)(ulong)in_stack_ffffffffffffffd0,
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if (IVar1 != 0) {
    uVar2 = uVar2 | 0x4000000;
  }
  local_14.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorage<Qt::KeyboardModifier>)
       QFlags<Qt::KeyboardModifier>::operator&
                 ((QFlags<Qt::KeyboardModifier> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  if (IVar1 != 0) {
    uVar2 = uVar2 | 0x10000000;
  }
  local_18.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorage<Qt::KeyboardModifier>)
       QFlags<Qt::KeyboardModifier>::operator&
                 ((QFlags<Qt::KeyboardModifier> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
  if (IVar1 != 0) {
    uVar2 = uVar2 | 0x8000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QKeySequenceEditPrivate::translateModifiers(Qt::KeyboardModifiers state, const QString &text)
{
    Q_UNUSED(text);
    int result = 0;
    if (state & Qt::ControlModifier)
        result |= Qt::CTRL;
    if (state & Qt::MetaModifier)
        result |= Qt::META;
    if (state & Qt::AltModifier)
        result |= Qt::ALT;
    return result;
}